

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BgzfStream::Close(BgzfStream *this)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  undefined4 *in_RDI;
  size_t blockLength;
  BgzfStream *in_stack_000002e0;
  int32_t in_stack_0000030c;
  BgzfStream *in_stack_00000310;
  
  if (*(long *)(in_RDI + 6) != 0) {
    uVar2 = (**(code **)(**(long **)(in_RDI + 6) + 0x50))();
    if (((uVar2 & 1) != 0) && (iVar1 = (**(code **)(**(long **)(in_RDI + 6) + 0x58))(), iVar1 == 2))
    {
      FlushBlock(in_stack_000002e0);
      sVar3 = DeflateBlock(in_stack_00000310,in_stack_0000030c);
      (**(code **)(**(long **)(in_RDI + 6) + 0x40))
                (*(long **)(in_RDI + 6),*(undefined8 *)(in_RDI + 0xc),sVar3 & 0xffffffff);
    }
    (**(code **)(**(long **)(in_RDI + 6) + 0x10))();
    if (*(long **)(in_RDI + 6) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 6) + 8))();
    }
    *(undefined8 *)(in_RDI + 6) = 0;
    RaiiBuffer::Clear((RaiiBuffer *)0x1cf794);
    RaiiBuffer::Clear((RaiiBuffer *)0x1cf7a2);
    *in_RDI = 0;
    in_RDI[1] = 0;
    *(undefined8 *)(in_RDI + 2) = 0;
    *(undefined1 *)(in_RDI + 4) = 1;
  }
  return;
}

Assistant:

void BgzfStream::Close(void) {

    // skip if no device open
    if ( m_device == 0 ) return;

    // if writing to file, flush the current BGZF block,
    // then write an empty block (as EOF marker)
    if ( m_device->IsOpen() && (m_device->Mode() == IBamIODevice::WriteOnly) ) {
        FlushBlock();
        const size_t blockLength = DeflateBlock(0);
        m_device->Write(m_compressedBlock.Buffer, blockLength);
    }

    // close device
    m_device->Close();
    delete m_device;
    m_device = 0;

    // ensure our buffers are cleared out
    m_uncompressedBlock.Clear();
    m_compressedBlock.Clear();

    // reset state
    m_blockLength = 0;
    m_blockOffset = 0;
    m_blockAddress = 0;
    m_isWriteCompressed = true;
}